

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_mem.c
# Opt level: O1

char * tnt_mem_dup(char *sz)

{
  size_t sVar1;
  void *__dest;
  char *pcVar2;
  
  sVar1 = strlen(sz);
  __dest = (*_tnt_realloc)((void *)0x0,sVar1 + 1);
  if (__dest != (void *)0x0) {
    pcVar2 = (char *)memcpy(__dest,sz,sVar1 + 1);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

char *tnt_mem_dup(char *sz) {
	size_t len = strlen(sz);
	char *szp = tnt_mem_alloc(len + 1);
	if (szp == NULL)
		return NULL;
	memcpy(szp, sz, len + 1);
	return szp;
}